

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O2

wchar_t archive_match_include_file_time_w(archive *_a,wchar_t flag,wchar_t *pathname)

{
  int error_number;
  wchar_t wVar1;
  size_t len;
  int *piVar2;
  char *fmt;
  archive_string local_38;
  
  wVar1 = validate_time_flag(_a,flag,"archive_match_include_file_time_w");
  if (wVar1 != L'\0') {
    return wVar1;
  }
  if ((pathname == (wchar_t *)0x0) || (*pathname == L'\0')) {
    fmt = "pathname is empty";
    error_number = 0x16;
  }
  else {
    local_38.s = (char *)0x0;
    local_38.length = 0;
    local_38.buffer_length = 0;
    len = wcslen(pathname);
    wVar1 = archive_string_append_from_wcs(&local_38,pathname,len);
    if (L'\xffffffff' < wVar1) {
      wVar1 = set_timefilter_pathname_mbs((archive_match *)_a,flag,local_38.s);
      archive_string_free(&local_38);
      return wVar1;
    }
    archive_string_free(&local_38);
    piVar2 = __errno_location();
    if (*piVar2 == 0xc) {
      error_nomem((archive_match *)_a);
      return L'\xffffffe2';
    }
    fmt = "Failed to convert WCS to MBS";
    error_number = -1;
  }
  archive_set_error(_a,error_number,fmt);
  return L'\xffffffe7';
}

Assistant:

int
archive_match_include_file_time_w(struct archive *_a, int flag,
    const wchar_t *pathname)
{
	int r;

	r = validate_time_flag(_a, flag, "archive_match_include_file_time_w");
	if (r != ARCHIVE_OK)
		return (r);
	return set_timefilter_pathname_wcs((struct archive_match *)_a,
			flag, pathname);
}